

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void libyuv::StoreAR30(uint8_t *rgb_buf,int b,int g,int r)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = b >> 4;
  iVar2 = g >> 4;
  iVar1 = r >> 4;
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  if (0x3fe < (int)uVar3) {
    uVar3 = 0x3ff;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  if (0x3fe < iVar2) {
    iVar2 = 0x3ff;
  }
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  if (0x3fe < iVar1) {
    iVar1 = 0x3ff;
  }
  *(uint *)rgb_buf = iVar1 * 0x100000 + (iVar2 << 10 | uVar3) + -0x40000000;
  return;
}

Assistant:

static void StoreAR30(uint8_t* rgb_buf, int b, int g, int r) {
  uint32_t ar30;
  b = b >> 4;  // convert 10.6 to 10 bit.
  g = g >> 4;
  r = r >> 4;
  b = Clamp10(b);
  g = Clamp10(g);
  r = Clamp10(r);
  ar30 = b | ((uint32_t)g << 10) | ((uint32_t)r << 20) | 0xc0000000;
  (*(uint32_t*)rgb_buf) = ar30;
}